

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O1

void __thiscall
mp::
BasicExprVisitor<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void,_mp::internal::ExprTypes>
::Visit(BasicExprVisitor<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void,_mp::internal::ExprTypes>
        *this,Expr e)

{
  tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_> tStack_3b8;
  EExpr EStack_1d8;
  
  switch(*(undefined4 *)e.super_ExprBase.impl_) {
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
    PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>
    ::VisitUnsupported((PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>
                        *)this,(Expr)e.super_ExprBase.impl_);
    return;
  case 0x1c:
    PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>
    ::VisitMul((PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>
                *)this,(BinaryExpr)e.super_ExprBase.impl_);
    return;
  case 0x3b:
    ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
    ::VisitAtLeast((ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
                    *)this,(LogicalCountExpr)e.super_ExprBase.impl_);
    return;
  case 0x3c:
    ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
    ::VisitAtMost((ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
                   *)this,(LogicalCountExpr)e.super_ExprBase.impl_);
    return;
  case 0x3d:
    ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
    ::VisitExactly((ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
                    *)this,(LogicalCountExpr)e.super_ExprBase.impl_);
    return;
  case 0x3e:
    ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
    ::VisitNotAtLeast((ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
                       *)this,(LogicalCountExpr)e.super_ExprBase.impl_);
    return;
  case 0x3f:
    ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
    ::VisitNotAtMost((ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
                      *)this,(LogicalCountExpr)e.super_ExprBase.impl_);
    return;
  case 0x40:
    ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
    ::VisitNotExactly((ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
                       *)this,(LogicalCountExpr)e.super_ExprBase.impl_);
    return;
  }
  BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
  ::Visit(&EStack_1d8,
          (BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
           *)this[8]._vptr_BasicExprVisitor,(Expr)e.super_ExprBase.impl_);
  tStack_3b8.super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>.
  super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
  super__Tuple_impl<2UL,_std::pair<double,_double>_>.
  super__Head_base<2UL,_std::pair<double,_double>,_false>._M_head_impl.first = 0.0;
  tStack_3b8.super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>.
  super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
  super__Tuple_impl<2UL,_std::pair<double,_double>_>.
  super__Head_base<2UL,_std::pair<double,_double>,_false>._M_head_impl.second = 0.0;
  std::_Head_base<1UL,_mp::EExpr,_false>::_Head_base<mp::EExpr>
            (&tStack_3b8.
              super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>.
              super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
              super__Head_base<1UL,_mp::EExpr,_false>,&EStack_1d8);
  tStack_3b8.super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>.
  super__Head_base<0UL,_std::pair<int,_double>,_false>._M_head_impl.first = 0;
  tStack_3b8.super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>.
  super__Head_base<0UL,_std::pair<int,_double>,_false>._M_head_impl.second = 0.0;
  if (6 < EStack_1d8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(EStack_1d8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    EStack_1d8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < EStack_1d8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(EStack_1d8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    EStack_1d8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < EStack_1d8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(EStack_1d8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    EStack_1d8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if (8 < EStack_1d8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
          m_data.
          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
          m_capacity) {
    operator_delete(EStack_1d8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_data_ptr,
                    EStack_1d8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_capacity << 4);
  }
  if (6 < EStack_1d8.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(EStack_1d8.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    EStack_1d8.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < EStack_1d8.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(EStack_1d8.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    EStack_1d8.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  gch::detail::
  small_vector_base<std::allocator<std::tuple<std::pair<int,double>,mp::EExpr,std::pair<double,double>>>,32u>
  ::append_element<std::tuple<std::pair<int,double>,mp::EExpr,std::pair<double,double>>>
            ((small_vector_base<std::allocator<std::tuple<std::pair<int,double>,mp::EExpr,std::pair<double,double>>>,32u>
              *)(this + 9),&tStack_3b8);
  if (6 < tStack_3b8.
          super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>.
          super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
          super__Head_base<1UL,_mp::EExpr,_false>._M_head_impl.super_QuadraticExpr.
          super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(tStack_3b8.
                    super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>
                    .super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
                    super__Head_base<1UL,_mp::EExpr,_false>._M_head_impl.super_QuadraticExpr.
                    super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    tStack_3b8.
                    super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>
                    .super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
                    super__Head_base<1UL,_mp::EExpr,_false>._M_head_impl.super_QuadraticExpr.
                    super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < tStack_3b8.
          super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>.
          super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
          super__Head_base<1UL,_mp::EExpr,_false>._M_head_impl.super_QuadraticExpr.
          super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(tStack_3b8.
                    super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>
                    .super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
                    super__Head_base<1UL,_mp::EExpr,_false>._M_head_impl.super_QuadraticExpr.
                    super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    tStack_3b8.
                    super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>
                    .super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
                    super__Head_base<1UL,_mp::EExpr,_false>._M_head_impl.super_QuadraticExpr.
                    super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < tStack_3b8.
          super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>.
          super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
          super__Head_base<1UL,_mp::EExpr,_false>._M_head_impl.super_QuadraticExpr.
          super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(tStack_3b8.
                    super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>
                    .super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
                    super__Head_base<1UL,_mp::EExpr,_false>._M_head_impl.super_QuadraticExpr.
                    super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    tStack_3b8.
                    super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>
                    .super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
                    super__Head_base<1UL,_mp::EExpr,_false>._M_head_impl.super_QuadraticExpr.
                    super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if (8 < tStack_3b8.
          super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>.
          super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
          super__Head_base<1UL,_mp::EExpr,_false>._M_head_impl.super_QuadraticExpr.
          super_QuadAndLinTerms.super_QuadTerms.folded_.
          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
          m_data.
          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
          m_capacity) {
    operator_delete(tStack_3b8.
                    super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>
                    .super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
                    super__Head_base<1UL,_mp::EExpr,_false>._M_head_impl.super_QuadraticExpr.
                    super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_data_ptr,
                    tStack_3b8.
                    super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>
                    .super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
                    super__Head_base<1UL,_mp::EExpr,_false>._M_head_impl.super_QuadraticExpr.
                    super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_capacity << 4);
  }
  if (6 < tStack_3b8.
          super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>.
          super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
          super__Head_base<1UL,_mp::EExpr,_false>._M_head_impl.super_QuadraticExpr.
          super_QuadAndLinTerms.super_LinTerms.vars_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(tStack_3b8.
                    super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>
                    .super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
                    super__Head_base<1UL,_mp::EExpr,_false>._M_head_impl.super_QuadraticExpr.
                    super_QuadAndLinTerms.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    tStack_3b8.
                    super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>
                    .super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
                    super__Head_base<1UL,_mp::EExpr,_false>._M_head_impl.super_QuadraticExpr.
                    super_QuadAndLinTerms.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < tStack_3b8.
          super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>.
          super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
          super__Head_base<1UL,_mp::EExpr,_false>._M_head_impl.super_QuadraticExpr.
          super_QuadAndLinTerms.super_LinTerms.coefs_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(tStack_3b8.
                    super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>
                    .super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
                    super__Head_base<1UL,_mp::EExpr,_false>._M_head_impl.super_QuadraticExpr.
                    super_QuadAndLinTerms.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    tStack_3b8.
                    super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>
                    .super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
                    super__Head_base<1UL,_mp::EExpr,_false>._M_head_impl.super_QuadraticExpr.
                    super_QuadAndLinTerms.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  return;
}

Assistant:

expr::Kind kind() const { return kind_; }